

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void __thiscall HTTPReplySender::post_done_event(HTTPReplySender *this,int sock_err,char *msg)

{
  bodyArg *in_RDX;
  undefined4 in_ESI;
  TadsHttpRequest *in_RDI;
  TadsHttpReplyResult *unaff_retaddr;
  TadsHttpReplyResult *evt;
  TadsMessage *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  int sock_err_00;
  undefined4 in_stack_fffffffffffffff0;
  TadsHttpRequest *req;
  
  sock_err_00 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  req = in_RDI;
  operator_new(0x68);
  TadsHttpReplyResult::TadsHttpReplyResult
            (unaff_retaddr,req,(vm_globalvar_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
             sock_err_00,in_stack_ffffffffffffffd8);
  TadsMessageQueue::post((TadsMessageQueue *)in_RDI,in_stack_ffffffffffffffb8);
  *(undefined8 *)&(in_RDI->super_TadsEventMessage).super_TadsMessage.completed = 0;
  in_RDI->headers = (StringRef *)0x0;
  (in_RDI->super_TadsEventMessage).super_TadsMessage.quit_evt = (OS_Event *)0x0;
  return;
}

Assistant:

void post_done_event(int sock_err, const char *msg)
    {
        /* establish the global context */
        VMGLOB_PTR(vmg);

        /* create the result event */
        TadsHttpReplyResult *evt = new TadsHttpReplyResult(
            vmg_ req, reqvar, body, sock_err, msg);
        
        /* queue the event (this transfers ownership to the queue) */
        queue->post(evt);

        /* forget the items that the event object took ownership of */
        req = 0;
        body = 0;
        reqvar = 0;
    }